

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O2

size_t write_lab(MIR_context_t ctx,writer_func_t writer,MIR_label_t lab)

{
  size_t *psVar1;
  uint64_t u;
  int nb;
  size_t sVar2;
  
  if (writer == (writer_func_t)0x0) {
    sVar2 = 0;
  }
  else {
    u = lab->ops[0].u.u;
    sVar2 = uint_length(u);
    if (4 < sVar2) {
      __assert_fail("nb <= 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                    ,0x12db,"size_t write_lab(MIR_context_t, writer_func_t, MIR_label_t)");
    }
    nb = (int)sVar2 + (uint)(sVar2 == 0);
    put_byte(ctx,writer,nb + 0x1f);
    sVar2 = put_uint(ctx,writer,u,nb);
    sVar2 = sVar2 + 1;
    psVar1 = &ctx->io_ctx->output_labs_len;
    *psVar1 = *psVar1 + sVar2;
  }
  return sVar2;
}

Assistant:

static size_t write_lab (MIR_context_t ctx, writer_func_t writer, MIR_label_t lab) {
  size_t nb, len;
  uint64_t lab_num;

  if (writer == NULL) return 0;
  lab_num = lab->ops[0].u.u;
  nb = uint_length (lab_num);
  mir_assert (nb <= 4);
  if (nb == 0) nb = 1;
  put_byte (ctx, writer, TAG_LAB1 + (int) nb - 1);
  len = put_uint (ctx, writer, lab_num, (int) nb) + 1;
  output_labs_len += len;
  return len;
}